

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O3

value_ptr __thiscall ent::value::readvalue(value *this,uint32_t id,ByteVector *data)

{
  _Alloc_hider _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t next;
  stringvalue *this_00;
  muistringvalue *this_01;
  dwordvalue *this_02;
  stringlistvalue *this_03;
  binaryvalue *this_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  value_ptr vVar6;
  ByteVector valdata;
  string name;
  Wstring w;
  MemoryReader r;
  ByteVector local_d8;
  string local_b8;
  Wstring local_98;
  string local_78;
  MemoryReader local_58;
  
  local_58._mem =
       (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_58._size =
       (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)local_58._mem;
  local_58.super_ReadWriter._vptr_ReadWriter = (_func_int **)&PTR__ReadWriter_0013c348;
  local_58._curpos = 0;
  local_58.super_ReadWriter._readonly = true;
  local_58.super_ReadWriter._9_1_ = 0;
  next = ReadWriter::read32le(&local_58.super_ReadWriter);
  uVar2 = ReadWriter::read16le(&local_58.super_ReadWriter);
  uVar3 = ReadWriter::read16le(&local_58.super_ReadWriter);
  uVar4 = ReadWriter::read16le(&local_58.super_ReadWriter);
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  readutf16le<MemoryReader*>(&local_58,&local_98,(ulong)uVar4);
  ToString<unsigned_short>(&local_b8,&local_98);
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vectorread8<MemoryReader*>(&local_58,&local_d8,(ulong)uVar3);
  _Var1._M_p = local_b8._M_dataplus._M_p;
  switch(uVar2) {
  case 1:
    this_00 = (stringvalue *)operator_new(0x90);
    stringvalue::stringvalue(this_00,id,next,&local_b8,&local_d8);
    (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter = (_func_int **)this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::stringvalue*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_base).super_MemoryReader.super_ReadWriter._readonly,this_00);
    _Var5._M_pi = extraout_RDX;
    break;
  case 3:
    this_04 = (binaryvalue *)operator_new(0x88);
    binaryvalue::binaryvalue(this_04,id,next,&local_b8,&local_d8);
    (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter = (_func_int **)this_04;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::binaryvalue*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_base).super_MemoryReader.super_ReadWriter._readonly,this_04);
    _Var5._M_pi = extraout_RDX_05;
    break;
  case 4:
    this_02 = (dwordvalue *)operator_new(0x78);
    dwordvalue::dwordvalue(this_02,id,next,&local_b8,&local_d8);
    (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter = (_func_int **)this_02;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::dwordvalue*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_base).super_MemoryReader.super_ReadWriter._readonly,this_02);
    _Var5._M_pi = extraout_RDX_03;
    break;
  case 7:
    this_03 = (stringlistvalue *)operator_new(0x88);
    stringlistvalue::stringlistvalue(this_03,id,next,&local_b8,&local_d8);
    (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter = (_func_int **)this_03;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::stringlistvalue*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_base).super_MemoryReader.super_ReadWriter._readonly,this_03);
    _Var5._M_pi = extraout_RDX_04;
    break;
  default:
    if (uVar2 == 0x15) {
      this_01 = (muistringvalue *)operator_new(0x90);
      muistringvalue::muistringvalue(this_01,id,next,&local_b8,&local_d8);
      (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter =
           (_func_int **)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::muistringvalue*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_base).super_MemoryReader.super_ReadWriter._readonly,this_01);
      _Var5._M_pi = extraout_RDX_00;
      break;
    }
  case 2:
  case 5:
  case 6:
    hexdump<unsigned_char_const*>
              (&local_78,
               local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
               (int)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,1,ET_LITTLEENDIAN);
    printf("WARNING: unsupported value type %d ( next:%08x name:%s, val:%s )\n",(ulong)uVar2,
           (ulong)next,_Var1._M_p,local_78._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      _Var5._M_pi = extraout_RDX_02;
    }
    (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter = (_func_int **)0x0;
    *(undefined8 *)&(this->super_base).super_MemoryReader.super_ReadWriter._readonly = 0;
  }
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var5._M_pi = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    _Var5._M_pi = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT62(local_98.field_2._M_allocated_capacity._2_6_,
                             local_98.field_2._M_local_buf[0]) * 2 + 2);
    _Var5._M_pi = extraout_RDX_08;
  }
  vVar6.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  vVar6.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (value_ptr)vVar6.super___shared_ptr<ent::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr value::readvalue(uint32_t id, const ByteVector& data)
{
    MemoryReader r(&data.front(), data.size());
    uint32_t nextvalue= r.read32le();
    uint16_t type= r.read16le();   // 1, 3, 4, 7, 21
    uint16_t vallen= r.read16le();  // max 0xc5a
    uint16_t namlen= r.read16le();  // max 0x75

    std::Wstring w;
    readutf16le(&r, w, namlen);
    std::string name= ToString(w);

    ByteVector valdata;
    vectorread8(&r, valdata, vallen);

    switch(type)
    {
        case VT_STRING: return value_ptr(new stringvalue(id, nextvalue, name, valdata));
        case VT_BINARY: return value_ptr(new binaryvalue(id, nextvalue, name, valdata));
        case VT_DWORD:  return value_ptr(new dwordvalue(id, nextvalue, name, valdata));
        case VT_STRINGLIST: return value_ptr(new stringlistvalue(id, nextvalue, name, valdata));
        case VT_MUI:    return value_ptr(new muistringvalue(id, nextvalue, name, valdata));
        default:
                        printf("WARNING: unsupported value type %d ( next:%08x name:%s, val:%s )\n", type, nextvalue, name.c_str(), vhexdump(valdata).c_str());
    }
    return value_ptr();
}